

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O1

bool __thiscall BaoSolver::checkIfConnect(BaoSolver *this,int v,uint32_t s)

{
  int *__s;
  uint uVar1;
  int (*paiVar2) [40];
  long lVar3;
  bool bVar4;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  uint local_90;
  uint local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  int (*local_38) [40];
  
  __s = this->dis;
  local_8c = v;
  memset(__s,0,0xa0);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           (_Elt_pointer)((uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_8c);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_8c;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  __s[(int)local_8c] = 1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_38 = this->edge;
    do {
      uVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      paiVar2 = local_38;
      local_90 = 0;
      if (0 < this->n) {
        do {
          lVar3 = (long)(int)local_90;
          if (((paiVar2[(int)uVar1][lVar3] != 0) && ((s >> (local_90 & 0x1f) & 1) != 0)) &&
             (__s[lVar3] != 1)) {
            __s[lVar3] = 1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
          local_90 = local_90 + 1;
        } while ((int)local_90 < this->n);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar4 = true;
  if (0 < (long)this->n) {
    lVar3 = 0;
    do {
      if ((s >> ((uint)lVar3 & 0x1f) & 1) != 0) {
        bVar4 = (bool)(bVar4 & (byte)__s[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (this->n != lVar3);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return bVar4;
}

Assistant:

bool BaoSolver::checkIfConnect(int v, uint32_t s) {
    memset(dis, 0, sizeof(dis));
    queue <int> q;
    while(!q.empty()) q.pop();
    q.push(v); dis[v] = 1;
    while(!q.empty()) {
        int tt = q.front(); q.pop();
        for (int i = 0; i < n; i++) if (edge[tt][i] && ((s >> i) & 1)) {
            if (dis[i] != 1) {
                dis[i] = 1;
                q.push(i);
            }
        }
    }
    bool flag = true;
    for (int i = 0; i < n; i++) if ((s >> i) & 1) {
        flag &= dis[i];
    }
    return flag;
}